

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHeader.cpp
# Opt level: O2

void __thiscall
Test<const_Imf_3_4::Header>::testIterators(Test<const_Imf_3_4::Header> *this,string *name)

{
  long lVar1;
  _Rb_tree_node_base *p_Var2;
  uint __line;
  bool bVar3;
  char *__assertion;
  _Rb_tree_node_base *p_Var4;
  undefined8 local_60;
  Header header;
  
  local_60 = 0;
  Imf_3_4::Header::Header(&header,0x40,0x40,1.0,(Vec2 *)&local_60,1.0,INCREASING_Y,ZIP_COMPRESSION);
  lVar1 = Imf_3_4::Header::find((char *)&header);
  lVar1 = *(long *)(lVar1 + 0x120);
  p_Var4 = (_Rb_tree_node_base *)Imf_3_4::Header::begin();
  do {
    p_Var2 = (_Rb_tree_node_base *)Imf_3_4::Header::end();
    if (p_Var4 == p_Var2) {
      __assertion = "false";
      __line = 0x39;
LAB_00157427:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                    ,__line,
                    "void Test<const Imf_3_4::Header>::testIterators(const string &) [Header = const Imf_3_4::Header]"
                   );
    }
    bVar3 = std::operator==((char *)(p_Var4 + 1),name);
    if (bVar3) {
      if (*(long *)(p_Var4 + 9) == lVar1) {
        Imf_3_4::Header::~Header(&header);
        return;
      }
      __assertion = "&iterator.attribute () == &comparand";
      __line = 0x34;
      goto LAB_00157427;
    }
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

void testIterators (const string& name)
    {
        Header header;

        auto& comparand = header.find ("displayWindow").attribute ();

        for (auto iterator = header.begin (); iterator != header.end ();
             ++iterator)
        {
            if (iterator.name () == name)
            {
                assert (&iterator.attribute () == &comparand);
                return;
            }
        }

        assert (false);
    }